

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

void __thiscall
MutableS2ShapeIndex::AddFaceEdge
          (MutableS2ShapeIndex *this,FaceEdge *edge,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *all_edges)

{
  Edge *this_00;
  S2Point *this_01;
  VType *pv;
  VType *pv_00;
  vector<MutableS2ShapeIndex::FaceEdge,std::allocator<MutableS2ShapeIndex::FaceEdge>> *this_02;
  uint uVar1;
  uint face_00;
  int32 iVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  int face;
  long lVar6;
  FaceEdge *pFVar7;
  iterator iVar8;
  byte bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  bVar9 = 0;
  dVar10 = ABS((edge->edge).v0.c_[0]);
  dVar11 = ABS((edge->edge).v0.c_[2]);
  dVar12 = ABS((edge->edge).v0.c_[1]);
  this_00 = &edge->edge;
  uVar1 = (dVar12 <= dVar11) + 1;
  if (dVar12 < dVar10) {
    uVar1 = (uint)(dVar10 <= dVar11) * 2;
  }
  dVar10 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                     ((BasicVector<Vector3,_double,_3UL> *)this_00,uVar1);
  face_00 = uVar1 + 3;
  if (0.0 <= dVar10) {
    face_00 = uVar1;
  }
  dVar10 = ABS((edge->edge).v1.c_[0]);
  dVar11 = ABS((edge->edge).v1.c_[2]);
  dVar12 = ABS((edge->edge).v1.c_[1]);
  this_01 = &(edge->edge).v1;
  uVar1 = (dVar12 <= dVar11) + 1;
  if (dVar12 < dVar10) {
    uVar1 = (uint)(dVar10 <= dVar11) * 2;
  }
  dVar10 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                     ((BasicVector<Vector3,_double,_3UL> *)this_01,uVar1);
  uVar4 = uVar1 + 3;
  if (0.0 <= dVar10) {
    uVar4 = uVar1;
  }
  if (face_00 == uVar4) {
    pv = (edge->a).c_ + 1;
    S2::ValidFaceXYZtoUV(face_00,&this_00->v0,(edge->a).c_,pv);
    pv_00 = (edge->b).c_ + 1;
    S2::ValidFaceXYZtoUV(face_00,this_01,(edge->b).c_,pv_00);
    dVar10 = 1.0 - kCellPadding;
    if ((((ABS((edge->a).c_[0]) <= dVar10) && (ABS(*pv) <= dVar10)) &&
        (ABS((edge->b).c_[0]) <= dVar10)) && (ABS(*pv_00) <= dVar10)) {
      this_02 = (vector<MutableS2ShapeIndex::FaceEdge,std::allocator<MutableS2ShapeIndex::FaceEdge>>
                 *)(all_edges + face_00);
      iVar8._M_current = *(FaceEdge **)(this_02 + 8);
      if (iVar8._M_current != *(FaceEdge **)(this_02 + 0x10)) {
        for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
          iVar2 = edge->edge_id;
          (iVar8._M_current)->shape_id = edge->shape_id;
          (iVar8._M_current)->edge_id = iVar2;
          edge = (FaceEdge *)((long)edge + (ulong)bVar9 * -0x10 + 8);
          iVar8._M_current = iVar8._M_current + (ulong)bVar9 * -0x10 + 8;
        }
        *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 0x60;
        return;
      }
      std::vector<MutableS2ShapeIndex::FaceEdge,std::allocator<MutableS2ShapeIndex::FaceEdge>>::
      _M_realloc_insert<MutableS2ShapeIndex::FaceEdge_const&>(this_02,iVar8,edge);
      return;
    }
  }
  lVar6 = 0;
  do {
    bVar3 = S2::ClipToPaddedFace(&this_00->v0,this_01,(int)lVar6,kCellPadding,&edge->a,&edge->b);
    if (bVar3) {
      iVar8._M_current = *(FaceEdge **)((long)all_edges + 8);
      if (iVar8._M_current == *(FaceEdge **)((long)all_edges + 0x10)) {
        std::vector<MutableS2ShapeIndex::FaceEdge,std::allocator<MutableS2ShapeIndex::FaceEdge>>::
        _M_realloc_insert<MutableS2ShapeIndex::FaceEdge_const&>
                  ((vector<MutableS2ShapeIndex::FaceEdge,std::allocator<MutableS2ShapeIndex::FaceEdge>>
                    *)all_edges,iVar8,edge);
      }
      else {
        pFVar7 = edge;
        for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
          iVar2 = pFVar7->edge_id;
          (iVar8._M_current)->shape_id = pFVar7->shape_id;
          (iVar8._M_current)->edge_id = iVar2;
          pFVar7 = (FaceEdge *)((long)pFVar7 + (ulong)bVar9 * -0x10 + 8);
          iVar8._M_current = iVar8._M_current + (ulong)bVar9 * -0x10 + 8;
        }
        *(long *)((long)all_edges + 8) = *(long *)((long)all_edges + 8) + 0x60;
      }
    }
    lVar6 = lVar6 + 1;
    all_edges = (vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 *)((long)all_edges + 0x18);
  } while (lVar6 != 6);
  return;
}

Assistant:

inline void MutableS2ShapeIndex::AddFaceEdge(
    FaceEdge* edge, vector<FaceEdge> all_edges[6]) const {
  // Fast path: both endpoints are on the same face, and are far enough from
  // the edge of the face that don't intersect any (padded) adjacent face.
  int a_face = S2::GetFace(edge->edge.v0);
  if (a_face == S2::GetFace(edge->edge.v1)) {
    S2::ValidFaceXYZtoUV(a_face, edge->edge.v0, &edge->a);
    S2::ValidFaceXYZtoUV(a_face, edge->edge.v1, &edge->b);
    const double kMaxUV = 1 - kCellPadding;
    if (fabs(edge->a[0]) <= kMaxUV && fabs(edge->a[1]) <= kMaxUV &&
        fabs(edge->b[0]) <= kMaxUV && fabs(edge->b[1]) <= kMaxUV) {
      all_edges[a_face].push_back(*edge);
      return;
    }
  }
  // Otherwise we simply clip the edge to all six faces.
  for (int face = 0; face < 6; ++face) {
    if (S2::ClipToPaddedFace(edge->edge.v0, edge->edge.v1, face,
                             kCellPadding, &edge->a, &edge->b)) {
      all_edges[face].push_back(*edge);
    }
  }
}